

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

ssize_t __thiscall
Json::FastWriter::write_abi_cxx11_(FastWriter *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  FastWriter *this_00;
  Value *root_local;
  FastWriter *this_local;
  
  this_00 = (FastWriter *)CONCAT44(in_register_00000034,__fd);
  std::__cxx11::string::operator=((string *)&this_00->document_,"");
  writeValue(this_00,(Value *)__buf);
  if ((this_00->omitEndingLineFeed_ & 1U) == 0) {
    std::__cxx11::string::operator+=((string *)&this_00->document_,"\n");
  }
  std::__cxx11::string::string((string *)this,(string *)&this_00->document_);
  return (ssize_t)this;
}

Assistant:

std::string FastWriter::write(const Value& root) {
  document_ = "";
  writeValue(root);
  if (!omitEndingLineFeed_)
    document_ += "\n";
  return document_;
}